

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

value_t __thiscall
pmean_filtration::compute_filtration
          (pmean_filtration *this,unsigned_short dimension,directed_flag_complex_cell_t *param_3,
          filtered_directed_graph_t *param_4,value_t *boundary_filtration)

{
  ushort in_SI;
  float *in_R8;
  value_t vVar1;
  value_t vVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined4 in_stack_ffffffffffffffc0;
  
  vVar1 = max<float_const*>(in_R8,0,(uint)in_SI);
  vVar2 = compute_filtration::anon_class_16_2_11ccf446::operator()
                    ((anon_class_16_2_11ccf446 *)CONCAT44(vVar1,in_stack_ffffffffffffffc0));
  dVar3 = std::pow((double)CONCAT44(extraout_XMM0_Db,vVar2),5.2220990168286e-315);
  return vVar1 + SUB84(dVar3,0) / ((float)in_SI + 1.0);
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {
		return (max(boundary_filtration, 0, dimension) +
		        pow(
		            [&]() {
			            value_t EXPRESSION_0 = 0.0f;
			            for (int COUNTER_A = (int)0; COUNTER_A <= (int)dimension; COUNTER_A++) {
				            EXPRESSION_0 += (pow(boundary_filtration[COUNTER_A], 2.0f));
			            }
			            return EXPRESSION_0;
		            }(),
		            (1.0f / 2.0f)) /
		            (dimension + 1.0f));
	}